

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# happly.h
# Opt level: O0

vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
* __thiscall
happly::Element::getDataFromListPropertyRecursive<unsigned_long,unsigned_long>
          (Element *this,Property *prop)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  runtime_error *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *in_RDI;
  Property *in_stack_00000010;
  Element *in_stack_00000018;
  TypeChain<unsigned_long> chainType;
  vector<unsigned_long,_std::allocator<unsigned_long>_> castedFlatVecCopy;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *castedFlatVec;
  TypedListProperty<unsigned_long> *castedProp;
  char *in_stack_fffffffffffffe70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffeb8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffec0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff10;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff18;
  string local_90 [39];
  TypeChain<unsigned_long> local_69 [65];
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_28;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  
  local_18 = in_RDX;
  if (in_RDX == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    this_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
  }
  else {
    this_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
              __dynamic_cast(in_RDX,&Property::typeinfo,&TypedListProperty<unsigned_long>::typeinfo,
                             0);
  }
  local_20 = this_00;
  if (this_00 == (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
    anon_unknown_3::TypeChain<unsigned_long>::TypeChain(local_69);
    if ((local_69[0].hasChildType & 1U) == 0) {
      uVar1 = 1;
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+((char *)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      std::operator+(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
      typeName<unsigned_long>();
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar1,in_stack_fffffffffffffea8),in_RDX);
      std::operator+(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
      (**(code **)(*(long *)local_18 + 0x58))(&stack0xfffffffffffffeb0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar1,in_stack_fffffffffffffea8),in_RDX);
      std::runtime_error::runtime_error(this_01,local_90);
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    getDataFromListPropertyRecursive<unsigned_long,unsigned_int>
              (in_stack_00000018,in_stack_00000010);
  }
  else {
    local_28 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x23951d);
    local_28 = (anonymous_namespace)::
               addressIfSame<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          &local_20[1].
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage,0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    anon_unknown_3::unflattenList<unsigned_long>
              (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(this_00);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(this_00);
  }
  return in_RDI;
}

Assistant:

std::vector<std::vector<D>> getDataFromListPropertyRecursive(Property* prop) {
    typedef typename CanonicalName<T>::type Tcan;

    TypedListProperty<Tcan>* castedProp = dynamic_cast<TypedListProperty<Tcan>*>(prop);
    if (castedProp) {
      // Succeeded, return a buffer of the data (copy while converting type)

      // Convert to flat buffer of new type
      std::vector<D>* castedFlatVec = nullptr;
      std::vector<D> castedFlatVecCopy; // we _might_ make a copy here, depending on is_same below

      if (std::is_same<std::vector<D>, std::vector<Tcan>>::value) {
        // just use the array we already have
        castedFlatVec = addressIfSame<std::vector<D>>(castedProp->flattenedData, 0 /* dummy arg to disambiguate */);
      } else {
        // make a copy
        castedFlatVecCopy.reserve(castedProp->flattenedData.size());
        for (Tcan& v : castedProp->flattenedData) {
          castedFlatVecCopy.push_back(static_cast<D>(v));
        }
        castedFlatVec = &castedFlatVecCopy;
      }

      // Unflatten and return
      return unflattenList(*castedFlatVec, castedProp->flattenedIndexStart);
    }

    TypeChain<Tcan> chainType;
    if (chainType.hasChildType) {
      return getDataFromListPropertyRecursive<D, typename TypeChain<Tcan>::type>(prop);
    } else {
      // No smaller type to try, failure
      throw std::runtime_error("PLY parser: list property " + prop->name +
                               " cannot be coerced to requested type list " + typeName<D>() + ". Has type list " +
                               prop->propertyTypeName());
    }
  }